

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fid_cgap.h
# Opt level: O3

int __thiscall
bwtil::fid_cgap::select
          (fid_cgap *this,int __nfds,fd_set *__readfds,fd_set *__writefds,fd_set *__exceptfds,
          timeval *__timeout)

{
  pointer puVar1;
  fd_set *__writefds_00;
  unsigned_long uVar2;
  ulint uVar3;
  __fd_mask *p_Var4;
  fd_set *pfVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  fd_set *pfVar9;
  undefined4 in_register_00000034;
  fd_set *__exceptfds_00;
  
  uVar7 = CONCAT44(in_register_00000034,__nfds) / this->t;
  puVar1 = (this->SEL).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  __writefds_00 =
       (fd_set *)
       (this->R_1).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_start;
  uVar2 = puVar1[uVar7];
  if ((timeval *)(uVar7 + 1) <
      (timeval *)
      ((long)(this->SEL).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish - (long)puVar1 >> 3)) {
    lVar8 = puVar1[uVar7 + 1] * 8 + 8;
  }
  else {
    lVar8 = (long)(this->R_1).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)__writefds_00;
  }
  __exceptfds_00 = (fd_set *)(uVar2 * 8);
  p_Var4 = __writefds_00->fds_bits + uVar2;
  pfVar9 = (fd_set *)((long)(lVar8 + uVar2 * -8) >> 3);
  while (pfVar5 = pfVar9, 0 < (long)pfVar5) {
    __exceptfds_00 = (fd_set *)((ulong)pfVar5 >> 1);
    pfVar9 = __exceptfds_00;
    if ((ulong)p_Var4[(long)__exceptfds_00] <= CONCAT44(in_register_00000034,__nfds)) {
      p_Var4 = p_Var4 + (long)((long)__exceptfds_00->fds_bits + 1);
      __exceptfds_00 = (fd_set *)((long)pfVar5->fds_bits + ~(ulong)__exceptfds_00);
      pfVar9 = __exceptfds_00;
    }
  }
  uVar3 = this->v;
  pfVar9 = (fd_set *)((long)p_Var4 - (long)__writefds_00 >> 3);
  uVar2 = (this->V_select).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
          .super__Vector_impl_data._M_start[(long)((long)pfVar9[-1].fds_bits + 0x7f)];
  iVar6 = bsd_cgap::select((this->BSDs).
                           super__Vector_base<bwtil::bsd_cgap,_std::allocator<bwtil::bsd_cgap>_>.
                           _M_impl.super__Vector_impl_data._M_start +
                           (long)((long)pfVar9[-1].fds_bits + 0x7f),
                           __nfds - (int)__writefds_00->fds_bits
                                         [(long)((long)pfVar9[-1].fds_bits + 0x7f)],pfVar9,
                           __writefds_00,__exceptfds_00,(timeval *)(uVar7 + 1));
  return iVar6 + (int)uVar3 * (int)uVar2;
}

Assistant:

ulint select(ulint i){

		assert(t>0);
		assert(n>0);
		assert(u>0);

		assert(i<n);

		ulint q_l = SEL[i/t];
		ulint q_r = R_1.size();

		if(i/t+1<SEL.size())
			q_r = SEL[i/t+1]+1;

		//i-th bit set is among V-marked blocks q_l,...,q_r
		//note that |{q_l,...,q_r}| <= t, so following binary search costs log t

		assert(q_l<R_1.size());

		ulint q_m = (std::upper_bound(R_1.begin()+q_l,R_1.begin()+q_r,i) - R_1.begin()) - 1;

		assert(R_1[q_m]<=i);

		assert(q_m+1 == R_1.size() || R_1[q_m+1]>i);

		assert(q_m<V_select.size());

		//now V_select[q_m] is the block containing the i-th set bit

		assert(q_m<BSDs.size());
		assert(q_m<R_1.size());
		assert(i>=R_1[q_m]);

		assert(i-R_1[q_m]<BSDs[q_m].number_of_1());

		return V_select[q_m]*v + BSDs[q_m].select(i-R_1[q_m]);

	}